

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::Texture2DSpecCase::verifyTexture
          (Texture2DSpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  ContextWrapper *this_00;
  TestLog *log;
  deUint32 program;
  bool bVar1;
  Surface *dst;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  RenderTarget *pRVar5;
  long *plVar6;
  long *plVar7;
  int width;
  int iVar8;
  ReferenceContext *pRVar9;
  void *pvVar10;
  int height;
  string levelStr;
  string name;
  string desc;
  Surface result;
  Surface reference;
  UVec4 threshold;
  Texture2DShader shader;
  long *local_438;
  float afStack_430 [2];
  long local_428 [2];
  Texture2DSpecCase *local_418;
  long *local_410;
  long local_408;
  long local_400;
  long lStack_3f8;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  Surface local_3d0;
  Surface local_3b8;
  long *local_3a0;
  ContextWrapper *local_398;
  TextureFormat local_390;
  ConstPixelBufferAccess local_388;
  UVec4 local_358;
  undefined1 local_348 [16];
  pointer local_338 [12];
  ios_base local_2d8 [272];
  Texture2DShader local_1c8;
  
  local_348._0_4_ = R;
  local_348._4_4_ = SNORM_INT8;
  local_348._8_8_ = (pointer)0x0;
  local_338[0] = (pointer)0x0;
  local_388.m_format.order = glu::getSampler2DType(this->m_texFormat);
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)local_348,(iterator)0x0,
             (DataType *)&local_388);
  local_388.m_format.order = 0x3f800000;
  local_388.m_format.type = 0x3f800000;
  local_388.m_size.m_data[0] = 0x3f800000;
  local_388.m_size.m_data[1] = 0x3f800000;
  local_438 = (long *)0x0;
  afStack_430[0] = 0.0;
  afStack_430[1] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&local_1c8,(DataTypes *)local_348,TYPE_FLOAT_VEC4,(Vec4 *)&local_388,(Vec4 *)&local_438
            );
  if ((TextureFormat)local_348._0_8_ != (TextureFormat)0x0) {
    operator_delete((void *)local_348._0_8_,(long)local_338[0] - local_348._0_8_);
  }
  dVar3 = (*(gles3Context->super_Context)._vptr_Context[0x75])(gles3Context,&local_1c8);
  dVar4 = (*(refContext->super_Context)._vptr_Context[0x75])();
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&local_1c8,0,&(this->m_texFormatInfo).lookupScale,&(this->m_texFormatInfo).lookupBias);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    pRVar9 = refContext;
    if (bVar1) {
      pRVar9 = (ReferenceContext *)gles3Context;
    }
    sglr::ContextWrapper::setContext(this_00,&pRVar9->super_Context);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x813d,this->m_numLevels + -1);
    bVar2 = false;
  } while (bVar1);
  if (0 < this->m_numLevels) {
    iVar8 = 0;
    local_418 = this;
    local_398 = this_00;
    do {
      width = this->m_width >> ((byte)iVar8 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = this->m_height >> ((byte)iVar8 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      tcu::Surface::Surface(&local_3b8);
      tcu::Surface::Surface(&local_3d0);
      bVar2 = true;
      do {
        bVar1 = bVar2;
        program = dVar4;
        dst = &local_3b8;
        pRVar9 = refContext;
        if (bVar1) {
          program = dVar3;
          dst = &local_3d0;
          pRVar9 = (ReferenceContext *)gles3Context;
        }
        sglr::ContextWrapper::setContext(local_398,&pRVar9->super_Context);
        FboTestUtil::Texture2DShader::setUniforms(&local_1c8,&pRVar9->super_Context,program);
        TextureSpecCase::renderTex(&local_418->super_TextureSpecCase,dst,program,width,height);
        this = local_418;
        bVar2 = false;
      } while (bVar1);
      pRVar5 = Context::getRenderTarget((local_418->super_TextureSpecCase).super_TestCase.m_context)
      ;
      computeCompareThreshold((Functional *)&local_358,&pRVar5->m_pixelFormat,this->m_texFormat);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
      std::ostream::operator<<((ostringstream *)local_348,iVar8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
      std::ios_base::~ios_base(local_2d8);
      local_348._0_8_ = local_338;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"Level","");
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_348,(ulong)local_438);
      local_410 = &local_400;
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_400 = *plVar7;
        lStack_3f8 = plVar6[3];
      }
      else {
        local_400 = *plVar7;
        local_410 = (long *)*plVar6;
      }
      local_408 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((pointer *)local_348._0_8_ != local_338) {
        operator_delete((void *)local_348._0_8_,(ulong)((long)local_338[0] + 1));
      }
      local_348._0_8_ = local_338;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"Level ","");
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_348,(ulong)local_438);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_3e0 = *plVar7;
        lStack_3d8 = plVar6[3];
        local_3f0 = &local_3e0;
      }
      else {
        local_3e0 = *plVar7;
        local_3f0 = (long *)*plVar6;
      }
      local_3e8 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((pointer *)local_348._0_8_ != local_338) {
        operator_delete((void *)local_348._0_8_,(ulong)((long)local_338[0] + 1));
      }
      plVar6 = local_410;
      log = ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
            m_log;
      local_3a0 = local_3f0;
      local_388.m_format.order = RGBA;
      local_388.m_format.type = UNORM_INT8;
      pvVar10 = (void *)local_3b8.m_pixels.m_cap;
      if ((void *)local_3b8.m_pixels.m_cap != (void *)0x0) {
        pvVar10 = local_3b8.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_348,&local_388.m_format,local_3b8.m_width,
                 local_3b8.m_height,1,pvVar10);
      local_390.order = RGBA;
      local_390.type = UNORM_INT8;
      pvVar10 = (void *)local_3d0.m_pixels.m_cap;
      if ((void *)local_3d0.m_pixels.m_cap != (void *)0x0) {
        pvVar10 = local_3d0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_388,&local_390,local_3d0.m_width,local_3d0.m_height,1,
                 pvVar10);
      bVar2 = tcu::intThresholdCompare
                        (log,(char *)plVar6,(char *)local_3a0,(ConstPixelBufferAccess *)local_348,
                         &local_388,&local_358,COMPARE_LOG_ON_ERROR - (iVar8 == 0));
      if (!bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
      }
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,local_3e0 + 1);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,local_400 + 1);
      }
      if (local_438 != local_428) {
        operator_delete(local_438,local_428[0] + 1);
      }
      tcu::Surface::~Surface(&local_3d0);
      tcu::Surface::~Surface(&local_3b8);
    } while ((bVar2) && (iVar8 = iVar8 + 1, iVar8 < this->m_numLevels));
  }
  FboTestUtil::Texture2DShader::~Texture2DShader(&local_1c8);
  return;
}

Assistant:

void Texture2DSpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture2DShader shader			(DataTypes() << glu::getSampler2DType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32		shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32		shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(0, m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
	{
		int				levelW		= de::max(1, m_width >> levelNdx);
		int				levelH		= de::max(1, m_height >> levelNdx);
		tcu::Surface	reference;
		tcu::Surface	result;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			tcu::Surface&	dst			= ndx ? reference									: result;
			sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
			deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

			setContext(ctx);
			shader.setUniforms(*ctx, shaderID);
			renderTex(dst, shaderID, levelW, levelH);
		}

		UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
		string			levelStr	= de::toString(levelNdx);
		string			name		= string("Level") + levelStr;
		string			desc		= string("Level ") + levelStr;
		bool			isOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
															   levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

		if (!isOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			break;
		}
	}
}